

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_CreateFailure_Test::testBody(TEST_TestFailure_CreateFailure_Test *this)

{
  UtestShell *pUVar1;
  undefined *fileName;
  undefined1 local_178 [8];
  TestFailure f3;
  undefined1 local_100 [8];
  TestFailure f2;
  SimpleString local_88;
  undefined1 local_78 [8];
  TestFailure f1;
  TEST_TestFailure_CreateFailure_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f1.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString(&local_88,"the failure message");
  TestFailure::TestFailure((TestFailure *)local_78,pUVar1,fileName,2,&local_88);
  SimpleString::~SimpleString(&local_88);
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)&f3.message_.bufferSize_,"the failure message");
  TestFailure::TestFailure((TestFailure *)local_100,pUVar1,(SimpleString *)&f3.message_.bufferSize_)
  ;
  SimpleString::~SimpleString((SimpleString *)&f3.message_.bufferSize_);
  TestFailure::TestFailure
            ((TestFailure *)local_178,(this->super_TEST_GROUP_CppUTestGroupTestFailure).test,
             (anonymous_namespace)::failFileName,2);
  TestFailure::~TestFailure((TestFailure *)local_178);
  TestFailure::~TestFailure((TestFailure *)local_100);
  TestFailure::~TestFailure((TestFailure *)local_78);
  return;
}

Assistant:

TEST(TestFailure, CreateFailure)
{
    TestFailure f1(test, failFileName, failLineNumber, "the failure message");
    TestFailure f2(test, "the failure message");
    TestFailure f3(test, failFileName, failLineNumber);
}